

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QList<QAccessibleInterface_*> * __thiscall QAccessibleTable::selectedCells(QAccessibleTable *this)

{
  bool bVar1;
  int iVar2;
  QItemSelectionModel *pQVar3;
  const_iterator o;
  QAccessibleTable *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index;
  QModelIndexList *__range1;
  QList<QAccessibleInterface_*> *cells;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList selectedIndexes;
  parameter_type this_00;
  undefined4 in_stack_ffffffffffffffb0;
  uint3 in_stack_ffffffffffffffb4;
  uint uVar4;
  QAccessibleTable *this_01;
  const_iterator local_28;
  QList<QModelIndex> local_20;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  uVar4 = (uint)in_stack_ffffffffffffffb4;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 8) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  this_01 = in_RSI;
  QList<QAccessibleInterface_*>::QList((QList<QAccessibleInterface_*> *)0x7f3850);
  view((QAccessibleTable *)0x7f385a);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
  if (pQVar3 == (QItemSelectionModel *)0x0) {
    uVar4 = 0x1000000;
  }
  else {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    view((QAccessibleTable *)0x7f38a8);
    QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
    QItemSelectionModel::selectedIndexes();
    QList<QModelIndex>::size(&local_20);
    QList<QAccessibleInterface_*>::reserve((QList<QAccessibleInterface_*> *)this_01,asize);
    local_28.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QModelIndex>::begin((QList<QModelIndex> *)this_00);
    o = QList<QModelIndex>::end((QList<QModelIndex> *)this_00);
    while( true ) {
      bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_28,o);
      if (!bVar1) break;
      QList<QModelIndex>::const_iterator::operator*(&local_28);
      iVar2 = logicalIndex(this_01,(QModelIndex *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
      (**(code **)(*(long *)in_RSI + 0x100))(in_RSI,iVar2);
      QList<QAccessibleInterface_*>::append((QList<QAccessibleInterface_*> *)0x7f398a,in_RDI);
      QList<QModelIndex>::const_iterator::operator++(&local_28);
    }
    uVar4 = 0x1000000;
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7f39ad);
  }
  if ((uVar4 & 0x1000000) == 0) {
    QList<QAccessibleInterface_*>::~QList((QList<QAccessibleInterface_*> *)0x7f39bd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == asize) {
    return (QList<QAccessibleInterface_*> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAccessibleInterface *> QAccessibleTable::selectedCells() const
{
    QList<QAccessibleInterface*> cells;
    if (!view()->selectionModel())
        return cells;
    const QModelIndexList selectedIndexes = view()->selectionModel()->selectedIndexes();
    cells.reserve(selectedIndexes.size());
    for (const QModelIndex &index : selectedIndexes)
        cells.append(child(logicalIndex(index)));
    return cells;
}